

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O3

void lrot32(void *blob,int len,int c)

{
  uint uVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int nbytes;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined1 (*pauVar11) [64];
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  
  if (c != 0) {
    iVar7 = len + 3;
    if (-1 < len) {
      iVar7 = len;
    }
    iVar7 = iVar7 >> 2;
    uVar1 = iVar7 - 1;
    iVar8 = c + 0x1f;
    if (-1 < c) {
      iVar8 = c;
    }
    if (0x1f < c) {
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar9 = 1;
      if ((int)uVar1 < 1) {
        uVar9 = uVar1;
      }
      auVar16 = vpbroadcastq_avx512f();
      iVar10 = 0;
      do {
        uVar2 = *(undefined4 *)((long)blob + (long)(int)uVar1 * 4);
        if (7 < len) {
          uVar12 = 0;
          pauVar11 = (undefined1 (*) [64])((long)blob + (ulong)uVar1 * 4 + -0x3c);
          do {
            auVar17 = vpbroadcastq_avx512f();
            uVar12 = uVar12 + 0x10;
            auVar18 = vporq_avx512f(auVar17,auVar14);
            auVar17 = vporq_avx512f(auVar17,auVar15);
            uVar5 = vpcmpuq_avx512f(auVar17,auVar16,2);
            uVar6 = vpcmpuq_avx512f(auVar18,auVar16,2);
            auVar17 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar6,(char)uVar5));
            auVar17 = vpshufd_avx512f(auVar17,0x1b);
            auVar17 = vshufi64x2_avx512f(auVar17,auVar17,0x1b);
            uVar13 = vpmovd2m_avx512dq(auVar17);
            auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pauVar11[-1] + 0x3c));
            auVar18._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar17._4_4_;
            auVar18._0_4_ = (uint)((byte)uVar13 & 1) * auVar17._0_4_;
            auVar18._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar17._8_4_;
            auVar18._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar17._12_4_;
            auVar18._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar17._16_4_;
            auVar18._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar17._20_4_;
            auVar18._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar17._24_4_;
            auVar18._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar17._28_4_;
            auVar18._32_4_ = (uint)((byte)(uVar13 >> 8) & 1) * auVar17._32_4_;
            auVar18._36_4_ = (uint)((byte)(uVar13 >> 9) & 1) * auVar17._36_4_;
            auVar18._40_4_ = (uint)((byte)(uVar13 >> 10) & 1) * auVar17._40_4_;
            auVar18._44_4_ = (uint)((byte)(uVar13 >> 0xb) & 1) * auVar17._44_4_;
            auVar18._48_4_ = (uint)((byte)(uVar13 >> 0xc) & 1) * auVar17._48_4_;
            auVar18._52_4_ = (uint)((byte)(uVar13 >> 0xd) & 1) * auVar17._52_4_;
            auVar18._56_4_ = (uint)((byte)(uVar13 >> 0xe) & 1) * auVar17._56_4_;
            auVar18._60_4_ = (uint)((byte)(uVar13 >> 0xf) & 1) * auVar17._60_4_;
            auVar17 = vmovdqu32_avx512f(auVar18);
            *pauVar11 = auVar17;
            pauVar11 = pauVar11 + -1;
          } while (((ulong)(~uVar9 + iVar7) + 0x10 & 0xfffffffffffffff0) != uVar12);
        }
        iVar10 = iVar10 + 1;
        *(undefined4 *)blob = uVar2;
      } while (iVar10 != iVar8 >> 5);
    }
    if (3 < len && (c & 0x1fU) != 0) {
      uVar9 = *(uint *)((long)blob + (long)(int)uVar1 * 4);
      uVar12 = (ulong)uVar1;
      do {
        iVar8 = *(int *)((long)blob + uVar12 * 4);
        if (uVar12 == 0) {
          bVar4 = (byte)c & 0x1f;
          *(uint *)blob = iVar8 << bVar4 | uVar9 >> 0x20 - bVar4;
          return;
        }
        bVar4 = (byte)c & 0x1f;
        iVar10 = iVar7 + -1;
        *(uint *)((long)blob + uVar12 * 4) =
             iVar8 << bVar4 | *(uint *)((long)blob + (uVar12 - 1) * 4) >> 0x20 - bVar4;
        bVar3 = 0 < iVar7;
        uVar12 = uVar12 - 1;
        iVar7 = iVar10;
      } while (iVar10 != 0 && bVar3);
    }
  }
  return;
}

Assistant:

void lrot32 ( void * blob, int len, int c )
{
  assert((len & 3) == 0);

  int nbytes  = len;
  int ndwords = nbytes/4;

  uint32_t * k = (uint32_t*)blob;

  if(c == 0) return;

  //----------

  int b = c / 32;
  c &= (32-1);

  for(int j = 0; j < b; j++)
  {
    uint32_t t = k[ndwords-1];

    for(int i = ndwords-1; i > 0; i--)
    {
      k[i] = k[i-1];
    }

    k[0] = t;
  }

  uint32_t t = k[ndwords-1];

  if(c == 0) return;

  for(int i = ndwords-1; i >= 0; i--)
  {
    uint32_t a = k[i];
    uint32_t b = (i == 0) ? t : k[i-1];

    k[i] = (a << c) | (b >> (32-c));
  }
}